

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_GetRootProperty<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  InlineCache *inlineCache;
  ScriptContext *requestContext;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  Var aValue;
  DynamicObject *propertyObject;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  Var value;
  
  uVar1 = playout->inlineCacheIndex;
  uVar4 = FunctionBody::GetCountField
                    (*(FunctionBody **)(this + 0x88),RootObjectLoadInlineCacheStart);
  if (uVar1 < uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xfe2,
                                "(playout->inlineCacheIndex >= this->m_functionBody->GetRootObjectLoadInlineCacheStart())"
                                ,
                                "playout->inlineCacheIndex >= this->m_functionBody->GetRootObjectLoadInlineCacheStart()"
                               );
    if (!bVar3) goto LAB_00a62989;
    *puVar5 = 0;
  }
  aValue = GetRootObject(this);
  uVar1 = playout->inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a62989;
    *puVar5 = 0;
  }
  if (*(uint *)(this + 200) <= uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) goto LAB_00a62989;
    *puVar5 = 0;
  }
  inlineCache = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8);
  propertyId = FunctionBody::GetPropertyIdFromCacheId
                         (*(FunctionBody **)(this + 0x88),playout->inlineCacheIndex);
  propertyObject = UnsafeVarTo<Js::DynamicObject>(aValue);
  local_88 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_88,*(FunctionBody **)(this + 0x88),inlineCache,
             playout->inlineCacheIndex,true);
  requestContext = *(ScriptContext **)(this + 0x78);
  if (info._8_8_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x21,
                                "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())",
                                "IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()");
    if (!bVar3) goto LAB_00a62989;
    *puVar5 = 0;
  }
  if (info.inlineCache != (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x22,
                                "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                ,
                                "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                               );
    if (!bVar3) {
LAB_00a62989:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar3 = InlineCache::TryGetProperty<true,false,false,false,false,false>
                    ((InlineCache *)info._8_8_,propertyObject,
                     &propertyObject->super_RecyclableObject,propertyId,
                     (Var *)&info.inlineCacheIndex,requestContext,(PropertyCacheOperationInfo *)0x0)
  ;
  if (bVar3) {
    SetReg<unsigned_int>(this,playout->Value,(Var)info._56_8_);
  }
  else {
    OP_GetRootProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
              (this,playout);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetRootProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Assert(playout->inlineCacheIndex >= this->m_functionBody->GetRootObjectLoadInlineCacheStart());
        Js::Var instance = this->GetRootObject();

        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        DynamicObject * obj = UnsafeVarTo<DynamicObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        Var value;
        if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
            obj, true, obj, propertyId, &value, GetScriptContext(), nullptr, &info))
        {
            SetReg(playout->Value, value);
            return;
        }

        OP_GetRootProperty_NoFastPath(playout);
    }